

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void anon_unknown.dwarf_1a4ea1::DecompressZip
               (uchar *dst,unsigned_long *uncompressedSize,uchar *src,unsigned_long srcSize)

{
  unsigned_long uVar1;
  int iVar2;
  undefined8 uVar3;
  uchar uVar4;
  long lVar5;
  uchar *puVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  allocator_type local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_40,*uncompressedSize,&local_41);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    iVar2 = mz_uncompress(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,uncompressedSize,src,srcSize);
    if (iVar2 == 0) {
      if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      else {
        uVar1 = *uncompressedSize;
        if (1 < (long)uVar1) {
          uVar4 = *local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar6 = local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1;
          do {
            uVar4 = uVar4 + *puVar6 + 0x80;
            *puVar6 = uVar4;
            puVar6 = puVar6 + 1;
          } while (puVar6 < local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar1);
        }
        if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar1 = *uncompressedSize;
          if (0 < (long)uVar1) {
            lVar5 = 0;
            do {
              puVar6 = dst + lVar5 * 2;
              *puVar6 = local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar5];
              if (dst + uVar1 <= puVar6 + 1) break;
              puVar6[1] = local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar5 + (uVar1 + 1 >> 1)];
              lVar5 = lVar5 + 1;
            } while (puVar6 + 2 < dst + uVar1);
          }
          if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (uchar *)0x0) {
            operator_delete(local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
      }
      uVar3 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
      if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar3);
    }
  }
  __assert_fail("ret == miniz::MZ_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                ,0x1bd2,
                "void (anonymous namespace)::DecompressZip(unsigned char *, unsigned long &, const unsigned char *, unsigned long)"
               );
}

Assistant:

void DecompressZip(unsigned char *dst, unsigned long &uncompressedSize,
                   const unsigned char *src, unsigned long srcSize) {
  std::vector<unsigned char> tmpBuf(uncompressedSize);

  int ret =
      miniz::mz_uncompress(&tmpBuf.at(0), &uncompressedSize, src, srcSize);
  assert(ret == miniz::MZ_OK);
  (void)ret;

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + uncompressedSize;

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = d;
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (uncompressedSize + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + uncompressedSize;

    while (true) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }
}